

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transmesh.c
# Opt level: O1

int main(int ArgCnt,char **ArgVec)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  undefined4 extraout_var;
  long lVar7;
  char *pcVar8;
  void *pvVar9;
  int64_t MshIdx;
  int64_t MshIdx_00;
  void *pvVar10;
  long lVar11;
  int *piVar12;
  uint uVar13;
  int64_t NmbLin;
  long lVar14;
  int iVar15;
  ulong uVar16;
  int NmbTyp;
  int NmbNod;
  int deg;
  int dim;
  int InpVer;
  int SolSiz;
  char *TmpStr2;
  char *TmpStr;
  int TokTab2 [1024];
  int TokTab [1024];
  int TypTab [1000];
  GrpSct GrpTab [1024];
  undefined4 *in_stack_ffffffffffff4fb8;
  undefined4 uVar17;
  uint local_b020;
  int local_b01c;
  ulong local_b018;
  undefined4 local_b00c;
  uint local_b008;
  uint local_b004;
  uint local_b000;
  undefined1 local_affc [4];
  char *local_aff8;
  char *local_aff0;
  char *local_afe8;
  char *local_afe0;
  int local_afd8 [1024];
  int local_9fd8 [1024];
  undefined1 local_8fd8 [4000];
  uint local_8038 [2];
  long local_8030;
  uint local_8028 [2];
  undefined8 local_8020 [4094];
  
  local_b01c = ArgCnt;
  if (ArgCnt == 1) {
    puts("\nTRANSMESH v5.2, july 19 2017, Loic MARECHAL / INRIA\n");
    puts(" Usage    : transmesh source_name destination_name (-options)\n");
    puts(" optional : -v output_file_version");
    puts(" version 1: 32 bits integers, 32 bits reals, file size < 2 GigaBytes");
    puts(" version 2: 32 bits integers, 64 bits reals, file size < 2 GigaBytes");
    puts(" version 3: 32 bits integers, 64 bits reals, file size < 8 ExaBytes");
    puts(" version 4: 64 bits integers, 64 bits reals, file size < 8 ExaBytes\n");
    puts(" optional : -igroup inflow 1 Triangles 3,5,6,9-14");
    puts("            Defines a group named \"inflow\" with index 1 that includes");
    puts("            a set of comma-seprated triangle references.");
    puts("            You may also specify ranges between two dash-separated indices.\n");
    puts(" optional : -egroup wings 3 Quadrilaterals 6-20");
    puts("            Defines a group named \"wings\" with index 3 that excludes");
    puts("            a set of comma-seprated quadrilateral references.");
    puts("            You may also specify ranges between two dash-separated indices.\n");
    exit(0);
  }
  local_aff0 = ArgVec[1];
  local_aff8 = ArgVec[2];
  iVar4 = strcmp(local_aff0,local_aff8);
  if (iVar4 == 0) {
    puts("The output mesh cannot overwrite the input mesh.");
LAB_00106b95:
    exit(1);
  }
  uVar13 = 0;
  memset(GmfMaxRefTab,0,0x3c4);
  local_b018 = 0;
  if (3 < local_b01c) {
    iVar4 = 3;
    local_b018 = 0;
    uVar13 = 0;
    do {
      iVar15 = iVar4 + 1;
      pcVar3 = ArgVec[iVar4];
      iVar5 = strcmp(pcVar3,"-v");
      if (iVar5 == 0) {
        iVar5 = atoi(ArgVec[iVar15]);
        local_b018 = CONCAT44(extraout_var,iVar5);
        if (iVar5 - 5U < 0xfffffffc) {
          printf("Wrong size type : %d\n",local_b018);
          goto LAB_00106b95;
        }
        iVar15 = iVar4 + 2;
      }
      iVar4 = strcmp(pcVar3,"-igroup");
      if ((iVar4 == 0) || (iVar5 = strcmp(pcVar3,"-egroup"), iVar4 = iVar15, iVar5 == 0)) {
        lVar7 = (long)(int)uVar13;
        uVar13 = uVar13 + 1;
        local_8020[lVar7 * 4] = ArgVec[iVar15];
        uVar6 = atoi(ArgVec[(long)iVar15 + 1]);
        local_8038[lVar7 * 8] = uVar6;
        pcVar8 = ArgVec[(long)iVar15 + 2];
        uVar6 = 1;
        lVar14 = 0x18;
        do {
          iVar4 = strcmp(*(char **)((long)GmfKwdFmt[0] + lVar14),pcVar8);
          if (iVar4 == 0) goto LAB_00106587;
          uVar6 = uVar6 + 1;
          lVar14 = lVar14 + 0x18;
        } while (lVar14 != 0x1698);
        uVar6 = 0;
LAB_00106587:
        local_8028[lVar7 * 8] = uVar6;
        local_8038[lVar7 * 8 + 1] = 0;
        iVar4 = iVar15 + 4;
        local_afe0 = ArgVec[(long)iVar15 + 3];
        uVar6 = 0;
        do {
          local_afe8 = strsep(&local_afe0,",");
          if (local_afe8 == (char *)0x0) break;
          lVar14 = 0;
          do {
            pcVar8 = strsep(&local_afe8,"-");
            if (pcVar8 == (char *)0x0) goto LAB_001065f7;
            iVar5 = atoi(pcVar8);
            local_afd8[lVar14] = iVar5;
            lVar14 = lVar14 + 1;
          } while (lVar14 == 1);
          lVar14 = 2;
LAB_001065f7:
          if ((int)lVar14 == 2) {
            if (local_afd8[0] <= local_afd8[1]) {
              piVar12 = local_9fd8 + (int)uVar6;
              uVar6 = (local_afd8[1] + uVar6 + 1) - local_afd8[0];
              iVar5 = local_afd8[0];
              do {
                *piVar12 = iVar5;
                iVar5 = iVar5 + 1;
                piVar12 = piVar12 + 1;
              } while (local_afd8[1] + 1 != iVar5);
            }
          }
          else {
            if ((int)lVar14 != 1) goto LAB_00106b95;
            lVar14 = (long)(int)uVar6;
            uVar6 = uVar6 + 1;
            local_9fd8[lVar14] = local_afd8[0];
          }
        } while ((int)uVar6 < 0x400);
        local_8038[lVar7 * 8 + 1] = uVar6;
        pvVar9 = malloc((long)(int)uVar6 * 4);
        (&local_8030)[lVar7 * 4] = (long)pvVar9;
        if (0 < (int)uVar6) {
          memcpy(pvVar9,local_9fd8,(ulong)uVar6 << 2);
        }
        iVar5 = strcmp(pcVar3,"-igroup");
        local_8028[lVar7 * 8 + 1] = -(uint)(iVar5 != 0) | 1;
      }
    } while (iVar4 < local_b01c);
  }
  MshIdx = GmfOpenMesh(local_aff0,1,&local_b000,&local_b004);
  if (MshIdx == 0) {
    main_cold_2();
  }
  else {
    uVar16 = local_b018;
    if ((int)local_b018 == 0) {
      uVar16 = (ulong)local_b000;
    }
    MshIdx_00 = GmfOpenMesh(local_aff8,2,uVar16,(ulong)local_b004);
    if (MshIdx_00 == 0) {
      main_cold_1();
    }
    else {
      lVar7 = 0;
      do {
        pcVar3 = GmfKwdFmt[lVar7][0];
        iVar4 = strcmp(pcVar3,"Reserved");
        if ((iVar4 != 0) && (iVar4 = strcmp(pcVar3,"End"), iVar4 != 0)) {
          iVar5 = (int)lVar7;
          iVar4 = GmfGotoKwd(MshIdx,iVar5);
          if (iVar4 != 0) {
            iVar4 = strcmp("i",GmfKwdFmt[lVar7][1]);
            if (iVar4 == 0) {
              pcVar3 = GmfKwdFmt[lVar7][2];
              iVar4 = strcmp("sr",pcVar3);
              if (iVar4 == 0) {
LAB_001068d3:
                ArgVec = (char **)GmfStatKwd(MshIdx,iVar5,&local_b020,local_affc,local_8fd8);
                if (ArgVec == (char **)0x0) goto LAB_0010694e;
                GmfSetKwd(MshIdx_00,iVar5,(int64_t)ArgVec,(ulong)local_b020,local_8fd8);
              }
              else {
                iVar15 = strcmp("hr",pcVar3);
                if (iVar15 == 0) {
                  if (iVar4 == 0) goto LAB_001068d3;
                  iVar4 = strcmp("hr",pcVar3);
                  if (iVar4 == 0) {
                    in_stack_ffffffffffff4fb8 = &local_b00c;
                    ArgVec = (char **)GmfStatKwd(MshIdx,iVar5,&local_b020,local_affc,local_8fd8,
                                                 &local_b008,in_stack_ffffffffffff4fb8);
                    if (ArgVec == (char **)0x0) goto LAB_0010694e;
                    in_stack_ffffffffffff4fb8 =
                         (undefined4 *)
                         CONCAT44((int)((ulong)in_stack_ffffffffffff4fb8 >> 0x20),local_b00c);
                    GmfSetKwd(MshIdx_00,iVar5,(int64_t)ArgVec,(ulong)local_b020,local_8fd8,
                              (ulong)local_b008,in_stack_ffffffffffff4fb8);
                  }
                }
                else {
                  ArgVec = (char **)GmfStatKwd(MshIdx,iVar5);
                  if (ArgVec == (char **)0x0) goto LAB_0010694e;
                  GmfSetKwd(MshIdx_00,iVar5,(int64_t)ArgVec);
                }
              }
LAB_0010691c:
              printf("Parsing %s : %ld item\n",GmfKwdFmt[lVar7][0],ArgVec);
              if (0 < (long)ArgVec) {
                lVar14 = 0;
                do {
                  GmfCpyLin(MshIdx,MshIdx_00,iVar5);
                  lVar14 = lVar14 + 1;
                } while (lVar14 < (long)ArgVec);
              }
            }
            else {
              ArgVec = (char **)GmfStatKwd(MshIdx,iVar5);
              if (ArgVec != (char **)0x0) {
                GmfSetKwd(MshIdx_00,iVar5,0);
                goto LAB_0010691c;
              }
LAB_0010694e:
              ArgVec = (char **)0x0;
            }
          }
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0xf1);
      if (uVar13 != 0) {
        NmbLin = 0;
        GmfSetKwd(MshIdx_00,0x5e,(long)(int)uVar13);
        if (0 < (int)uVar13) {
          iVar4 = 1;
          iVar5 = 0;
          do {
            uVar17 = (undefined4)((ulong)in_stack_ffffffffffff4fb8 >> 0x20);
            lVar7 = (long)iVar5;
            if (local_8028[lVar7 * 8 + 1] == 0xffffffff) {
              uVar6 = GmfMaxRefTab[(int)local_8028[lVar7 * 8]];
              if (GmfMaxRefTab[(int)local_8028[lVar7 * 8]] == 0) {
                uVar6 = 0x400;
              }
              pvVar9 = malloc((long)(int)(uVar6 + 1));
              if (0 < (int)uVar6) {
                memset((void *)((long)pvVar9 + 1),1,(ulong)uVar6);
              }
              uVar1 = local_8038[lVar7 * 8 + 1];
              if (0 < (long)(int)uVar1) {
                lVar14 = (&local_8030)[lVar7 * 4];
                lVar11 = 0;
                do {
                  *(undefined1 *)((long)pvVar9 + (long)*(int *)(lVar14 + lVar11 * 4)) = 0;
                  lVar11 = lVar11 + 1;
                } while ((int)uVar1 != lVar11);
              }
              free((void *)(&local_8030)[lVar7 * 4]);
              local_8038[lVar7 * 8 + 1] = uVar6 - uVar1;
              pvVar10 = malloc((long)(int)(uVar6 - uVar1) << 2);
              (&local_8030)[lVar7 * 4] = (long)pvVar10;
              if ((int)uVar6 < 1) {
                uVar16 = 1;
                iVar4 = 0;
              }
              else {
                iVar4 = 0;
                uVar16 = 1;
                do {
                  if (*(char *)((long)pvVar9 + uVar16) != '\0') {
                    lVar14 = (long)iVar4;
                    iVar4 = iVar4 + 1;
                    *(int *)((long)pvVar10 + lVar14 * 4) = (int)uVar16;
                  }
                  uVar16 = uVar16 + 1;
                } while (uVar6 + 1 != uVar16);
              }
              iVar5 = (int)uVar16;
              free(pvVar9);
            }
            uVar6 = local_8038[lVar7 * 8 + 1];
            in_stack_ffffffffffff4fb8 = (undefined4 *)CONCAT44(uVar17,iVar4);
            GmfSetLin(MshIdx_00,0x5e,local_8020[lVar7 * 4],(ulong)local_8038[lVar7 * 8],
                      (ulong)local_8028[lVar7 * 8],(ulong)uVar6,in_stack_ffffffffffff4fb8);
            iVar4 = uVar6 + iVar4;
            iVar5 = iVar5 + 1;
          } while (iVar5 < (int)uVar13);
          NmbLin = (int64_t)(iVar4 + -1);
        }
        GmfSetKwd(MshIdx_00,0x5f,NmbLin);
        if (0 < (int)uVar13) {
          uVar16 = 0;
          do {
            uVar6 = local_8038[uVar16 * 8 + 1];
            if (0 < (long)(int)uVar6) {
              uVar1 = local_8028[uVar16 * 8];
              lVar7 = (&local_8030)[uVar16 * 4];
              uVar2 = local_8038[uVar16 * 8];
              lVar14 = 0;
              do {
                GmfSetLin(MshIdx_00,0x5f,(ulong)uVar1,(ulong)*(uint *)(lVar7 + lVar14 * 4),
                          (ulong)uVar2);
                lVar14 = lVar14 + 1;
              } while ((int)uVar6 != lVar14);
            }
            uVar16 = uVar16 + 1;
          } while (uVar16 != uVar13);
        }
      }
      iVar4 = GmfCloseMesh(MshIdx);
      if (iVar4 != 0) {
        iVar4 = GmfCloseMesh(MshIdx_00);
        return (uint)(iVar4 == 0);
      }
    }
  }
  return 1;
}

Assistant:

int main(int ArgCnt, char **ArgVec)
{
   int      NmbTyp, SolSiz, TypTab[ GmfMaxTyp ], FilVer = 0, InpVer, OutVer = 1;
   int      i, j, dim, MaxRef, ArgIdx = 1, NmbGrp = 0, pos, deg, NmbNod;
   int64_t  NmbLin, InpIdx, OutIdx;
   char     *InpNam, *OutNam, *PtrArg, *FlgTab;
   GrpSct   GrpTab[ MaxGrp ], *grp;
#ifndef WIN32
   float    f;
   double   d;
   int      NmbTok, NmbTok2, TokTab[ MaxTok ], TokTab2[ MaxTok ];
   char     *MshNam[ StrSiz ], *TmpStr, *TmpStr2, *TmpStr3;
#endif

   if(ArgCnt == 1)
   {
      puts("\nTRANSMESH v5.2, july 19 2017, Loic MARECHAL / INRIA\n");
      puts(" Usage    : transmesh source_name destination_name (-options)\n");
      puts(" optional : -v output_file_version");
      puts(" version 1: 32 bits integers, 32 bits reals, file size < 2 GigaBytes");
      puts(" version 2: 32 bits integers, 64 bits reals, file size < 2 GigaBytes");
      puts(" version 3: 32 bits integers, 64 bits reals, file size < 8 ExaBytes");
      puts(" version 4: 64 bits integers, 64 bits reals, file size < 8 ExaBytes\n");
#ifndef WIN32
      puts(" optional : -igroup inflow 1 Triangles 3,5,6,9-14");
      puts("            Defines a group named \"inflow\" with index 1 that includes");
      puts("            a set of comma-seprated triangle references.");
      puts("            You may also specify ranges between two dash-separated indices.\n");
      puts(" optional : -egroup wings 3 Quadrilaterals 6-20");
      puts("            Defines a group named \"wings\" with index 3 that excludes");
      puts("            a set of comma-seprated quadrilateral references.");
      puts("            You may also specify ranges between two dash-separated indices.\n");
#endif
      exit(0);
   }

   InpNam = ArgVec[ ArgIdx++ ];
   OutNam = ArgVec[ ArgIdx++ ];

   if(!strcmp(InpNam, OutNam))
   {
      puts("The output mesh cannot overwrite the input mesh.");
      exit(1);
   }

   memset(GmfMaxRefTab, 0, (GmfMaxKwd + 1) * sizeof(int));

   while(ArgIdx < ArgCnt)
   {
      PtrArg = ArgVec[ ArgIdx++ ];

      if(!strcmp(PtrArg, "-v"))
      {
         FilVer = atoi(ArgVec[ ArgIdx++ ]);

         if( (FilVer < 1) || (FilVer > 4) )
         {
            printf("Wrong size type : %d\n", FilVer);
            exit(1);
         }
      }
#ifndef WIN32
      if(!strcmp(PtrArg, "-igroup") || !strcmp(PtrArg, "-egroup"))
      {
         grp = &GrpTab[ NmbGrp++ ];
         grp->NfoStr = ArgVec[ ArgIdx++ ];
         grp->idx = atoi(ArgVec[ ArgIdx++ ]);
         grp->typ = GetKwdIdx(ArgVec[ ArgIdx++ ]);
         grp->NmbRef = 0;
         NmbTok = 0;
         TmpStr = ArgVec[ ArgIdx++ ];

         while( (NmbTok < MaxTok) && ((TmpStr2 = strsep(&TmpStr, ","))) )
         {
            NmbTok2 = 0;

            while( (NmbTok2 < 2) && ((TmpStr3 = strsep(&TmpStr2, "-"))) )
               TokTab2[ NmbTok2++ ] = atoi(TmpStr3);

            if(NmbTok2 == 1)
               TokTab[ NmbTok++ ] = TokTab2[0];
            else if(NmbTok2 == 2)
               for(i=TokTab2[0]; i<=TokTab2[1]; i++)
                  TokTab[ NmbTok++ ] = i;
            else
               exit(1);
         }

         grp->NmbRef = NmbTok;
         grp->RefTab = malloc(grp->NmbRef * sizeof(int));

         for(i=0;i<grp->NmbRef;i++)
            grp->RefTab[i] = TokTab[i];

         if(!strcmp(PtrArg, "-igroup"))
            grp->sgn = 1;
         else
            grp->sgn = -1;
      }
#endif
   }

   if(!(InpIdx = GmfOpenMesh(InpNam, GmfRead, &InpVer, &dim)))
   {
      fprintf(stderr,"Source of error : TRANSMESH / OPEN_MESH\n");
      fprintf(stderr,"Cannot open %s\n", InpNam);
      return(1);
   }

   if(FilVer)
      OutVer = FilVer;
   else
      OutVer = InpVer;

   if(!(OutIdx = GmfOpenMesh(OutNam, GmfWrite, OutVer, dim)))
   {
      fprintf(stderr,"Source of error : TRANSMESH / OPEN_MESH\n");
      fprintf(stderr,"Cannot open %s\n", OutNam);
      return(1);
   }

   for(i=0;i<=GmfMaxKwd;i++)
   {
      if(!strcmp(GmfKwdFmt[i][0], "Reserved") || !strcmp(GmfKwdFmt[i][0], "End"))
         continue;

      if(!GmfGotoKwd(InpIdx, i))
         continue;

      if(strcmp("i", GmfKwdFmt[i][1]))
      {
         if((NmbLin = GmfStatKwd(InpIdx, i)))
            GmfSetKwd(OutIdx, i, 0);
         else
            continue;
      }
      else if(strcmp("sr", GmfKwdFmt[i][2]) && strcmp("hr", GmfKwdFmt[i][2]))
      {
         if((NmbLin = GmfStatKwd(InpIdx, i)))
            GmfSetKwd(OutIdx, i, NmbLin);
         else
            continue;
      }
      else
      {
         if(!strcmp("sr", GmfKwdFmt[i][2]))
         {
            if((NmbLin = GmfStatKwd(InpIdx, i, &NmbTyp, &SolSiz, TypTab)))
               GmfSetKwd(OutIdx, i,  NmbLin, NmbTyp, TypTab);
            else
               continue;
         }
         else if(!strcmp("hr", GmfKwdFmt[i][2]))
         {
            if((NmbLin = GmfStatKwd(InpIdx, i, &NmbTyp, &SolSiz, TypTab, &deg, &NmbNod)))
               GmfSetKwd(OutIdx, i,  NmbLin, NmbTyp, TypTab, deg, NmbNod);
            else
               continue;
         }
      }

      printf("Parsing %s : "INT64_T_FMT" item\n", GmfKwdFmt[i][0], NmbLin);

      for(j=1;j<=NmbLin;j++)
         GmfCpyLin(InpIdx, OutIdx, i);
   }

   if(NmbGrp)
   {
      GmfSetKwd(OutIdx, GmfIRefGroups, NmbGrp);
      pos = 1;

      for(i=0;i<NmbGrp;i++)
      {
         grp = &GrpTab[i];

         if(grp->sgn == -1)
         {
            MaxRef = GmfMaxRefTab[ grp->typ ] ? GmfMaxRefTab[ grp->typ ] : DefMaxRef;
            FlgTab = malloc(MaxRef+1);

            for(i=1;i<=MaxRef;i++)
               FlgTab[i] = 1;

            for(i=0;i<grp->NmbRef;i++)
               FlgTab[ grp->RefTab[i] ] = 0;

            free(grp->RefTab);
            grp->NmbRef = MaxRef - grp->NmbRef;
            grp->RefTab = malloc(grp->NmbRef * sizeof(int));
            pos = 0;

            for(i=1;i<=MaxRef;i++)
               if(FlgTab[i])
                  grp->RefTab[ pos++ ] = i;

            free(FlgTab);
         }

         GmfSetLin(OutIdx, GmfIRefGroups, grp->NfoStr, grp->idx, grp->typ, grp->NmbRef, pos);
         pos += grp->NmbRef;
      }

      GmfSetKwd(OutIdx, GmfDRefGroups, pos - 1);

      for(i=0;i<NmbGrp;i++)
      {
         grp = &GrpTab[i];

         for(j=0;j<grp->NmbRef;j++)
            GmfSetLin(OutIdx, GmfDRefGroups, grp->typ, grp->RefTab[j], grp->idx);
      }
   }

   if(!GmfCloseMesh(InpIdx))
      return(1);

   if(!GmfCloseMesh(OutIdx))
      return(1);

   return(0);
}